

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator.cpp
# Opt level: O0

void __thiscall
helics::Translator::setTranslatorOperations
          (Translator *this,shared_ptr<helics::TranslatorOperations> *translatorOps)

{
  bool bVar1;
  element_type *peVar2;
  long in_RDI;
  shared_ptr<helics::TranslatorOperations> *in_stack_ffffffffffffffa8;
  shared_ptr<helics::TranslatorOperations> *in_stack_ffffffffffffffb0;
  shared_ptr<helics::TranslatorOperator> *this_00;
  bool local_2a;
  undefined1 local_28 [20];
  undefined4 local_14;
  
  std::shared_ptr<helics::TranslatorOperations>::operator=
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (*(long *)(in_RDI + 8) != 0) {
    this_00 = *(shared_ptr<helics::TranslatorOperator> **)(in_RDI + 8);
    local_14 = *(undefined4 *)(in_RDI + 0x10);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x40));
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x31c69d);
      (*peVar2->_vptr_TranslatorOperations[4])(local_28);
    }
    else {
      std::shared_ptr<helics::TranslatorOperator>::shared_ptr(this_00,in_stack_ffffffffffffffa8);
    }
    (*(code *)(this_00->super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr[0x2a].minDelay.internalTimeCode)(this_00,local_14,local_28);
    if (bVar1) {
      std::shared_ptr<helics::TranslatorOperator>::~shared_ptr
                ((shared_ptr<helics::TranslatorOperator> *)0x31c707);
    }
    else {
      std::shared_ptr<helics::TranslatorOperator>::~shared_ptr
                ((shared_ptr<helics::TranslatorOperator> *)0x31c6f4);
    }
  }
  return;
}

Assistant:

void Translator::setTranslatorOperations(std::shared_ptr<TranslatorOperations> translatorOps)
{
    transOp = std::move(translatorOps);
    if (mCore != nullptr) {
        mCore->setTranslatorOperator(handle, (transOp) ? transOp->getOperator() : nullptr);
    }
}